

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O1

void __thiscall QBoxLayout::insertStretch(QBoxLayout *this,int index,int stretch)

{
  QBoxLayoutPrivate *this_00;
  int iVar1;
  QSpacerItem *pQVar2;
  Policy hPolicy;
  Policy vPolicy;
  long in_FS_OFFSET;
  QBoxLayoutItem *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QBoxLayoutPrivate **)&(this->super_QLayout).field_0x8;
  iVar1 = QBoxLayoutPrivate::validateIndex(this_00,index);
  if (this_00->dir < Down) {
    hPolicy = Expanding;
    vPolicy = Minimum;
  }
  else {
    hPolicy = Minimum;
    vPolicy = Expanding;
  }
  pQVar2 = QLayoutPrivate::createSpacerItem(&this->super_QLayout,0,0,hPolicy,vPolicy);
  local_38 = (QBoxLayoutItem *)operator_new(0x10);
  local_38->item = &pQVar2->super_QLayoutItem;
  local_38->stretch = stretch;
  local_38->magic = true;
  QtPrivate::QPodArrayOps<QBoxLayoutItem*>::emplace<QBoxLayoutItem*&>
            ((QPodArrayOps<QBoxLayoutItem*> *)&this_00->list,(long)iVar1,&local_38);
  QList<QBoxLayoutItem_*>::begin(&this_00->list);
  (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBoxLayout::insertStretch(int index, int stretch)
{
    Q_D(QBoxLayout);
    index = d->validateIndex(index);
    QLayoutItem *b;
    if (horz(d->dir))
        b = QLayoutPrivate::createSpacerItem(this, 0, 0, QSizePolicy::Expanding, QSizePolicy::Minimum);
    else
        b = QLayoutPrivate::createSpacerItem(this, 0, 0, QSizePolicy::Minimum, QSizePolicy::Expanding);

    QBoxLayoutItem *it = new QBoxLayoutItem(b, stretch);
    it->magic = true;
    d->list.insert(index, it);
    invalidate();
}